

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

size_t sysbvm_string_computeHashWithBytes(size_t size,uint8_t *bytes)

{
  ulong local_28;
  size_t i;
  size_t result;
  uint8_t *bytes_local;
  size_t size_local;
  
  i = sysbvm_hashMultiply(1);
  for (local_28 = 0; local_28 < size; local_28 = local_28 + 1) {
    i = sysbvm_hashConcatenate(i,(ulong)bytes[local_28]);
  }
  return i;
}

Assistant:

SYSBVM_API size_t sysbvm_string_computeHashWithBytes(size_t size, const uint8_t *bytes)
{
    size_t result = sysbvm_hashMultiply(1);
    for(size_t i = 0; i < size; ++i)
        result = sysbvm_hashConcatenate(result, bytes[i]);
    return result;
}